

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossPlatformReporters.cpp
# Opt level: O1

void __thiscall
ApprovalTests::CrossPlatform::CrossPlatformDiffReporter::CrossPlatformDiffReporter
          (CrossPlatformDiffReporter *this)

{
  VisualStudioCodeReporter *this_00;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_31;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_30;
  VisualStudioCodeReporter *local_18;
  
  this_00 = (VisualStudioCodeReporter *)operator_new(0x70);
  VisualStudioCodeReporter::VisualStudioCodeReporter(this_00);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_18;
  local_18 = this_00;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (&local_30,__l,&local_31);
  FirstWorkingReporter::FirstWorkingReporter(&this->super_FirstWorkingReporter,&local_30);
  if (local_30.
      super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_00142ba0;
  return;
}

Assistant:

CrossPlatformDiffReporter::CrossPlatformDiffReporter()
            : FirstWorkingReporter({
                  // begin-snippet: cross_platform_diff_reporters
                  new VisualStudioCodeReporter(),
                  // end-snippet
              })
        {
        }